

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_chill(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  AFFECT_DATA af;
  
  act("You draw the heat out of $N\'s flesh, chilling $M.",ch,(void *)0x0,vo,3);
  iVar2 = dice(5,4);
  iVar2 = iVar2 + level;
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,5);
  if (bVar1) {
    iVar2 = iVar2 / 2;
  }
  else {
    init_affect(&af);
    af.where = 0;
    af.aftype = 3;
    af.type = (short)sn;
    af.duration = 10;
    af.location = 1;
    af.level = (short)level;
    af.modifier = -2;
    af.owner = ch;
    bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_chill);
    if (bVar1) {
      affect_join((CHAR_DATA *)vo,&af);
    }
    else {
      affect_to_char((CHAR_DATA *)vo,&af);
    }
    act("$n\'s flesh turns purple as he shivers!",(CHAR_DATA *)vo,(void *)0x0,ch,0);
    act("You begin shivering violently.",(CHAR_DATA *)0x0,(void *)0x0,vo,2);
  }
  damage_new(ch,(CHAR_DATA *)vo,iVar2,-1,5,true,false,0,1,"chill");
  return;
}

Assistant:

void spell_chill(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	act("You draw the heat out of $N's flesh, chilling $M.", ch, 0, victim, TO_CHAR);

	int dam = dice(5, 4) + level;

	if (!saves_spell(level, victim, DAM_COLD))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = sn;
		af.location = APPLY_STR;
		af.owner = ch;
		af.duration = 10;
		af.level = level;
		af.modifier = -2;

		if (is_affected(victim, gsn_chill))
			affect_join(victim, &af);
		else
			affect_to_char(victim, &af);

		act("$n's flesh turns purple as he shivers!", victim, 0, ch, TO_ROOM);
		act("You begin shivering violently.", 0, 0, victim, TO_VICT);
		damage_new(ch, victim, dam, TYPE_UNDEFINED, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "chill");
	}
	else
	{
		dam /= 2;
		damage_new(ch, victim, dam, TYPE_UNDEFINED, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "chill");
	}
}